

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf_iterator.h
# Opt level: O1

uint32_t cppcms::utf8::next<char_const*>(char **p,char *e,bool html,bool param_4)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  uchar c;
  uint uVar5;
  uint32_t uVar6;
  
  pbVar2 = (byte *)*p;
  uVar6 = 0xffffffff;
  if (pbVar2 != (byte *)e) {
    *p = (char *)(pbVar2 + 1);
    bVar1 = *pbVar2;
    uVar4 = 0;
    if (((((char)bVar1 < '\0') && (uVar4 = 0xffffffff, 0xc1 < bVar1)) && (uVar4 = 1, 0xdf < bVar1))
       && (uVar4 = 2, 0xef < bVar1)) {
      uVar4 = (bVar1 < 0xf5) - 1 | 3;
    }
    uVar6 = 0xffffffff;
    if (-1 < (int)uVar4) {
      uVar6 = (uint32_t)bVar1;
      if (uVar4 == 0) {
        if (((html) && (bVar1 < 0x20 || uVar6 == 0x7f)) &&
           (uVar6 = 0xffffffff, (byte)(bVar1 - 9) < 5)) {
          uVar6 = *(uint32_t *)(&DAT_00246118 + (ulong)(byte)(bVar1 - 9) * 4);
        }
      }
      else {
        uVar5 = ~(-1 << (6U - (char)uVar4 & 0x1f)) & uVar6;
        if (uVar4 == 1) {
          if (*p == e) {
            uVar6 = 0xffffffff;
          }
          else {
            *p = *p + 1;
            uVar6 = 0xffffffff;
          }
        }
        else if (uVar4 == 2) {
          uVar6 = 0xffffffff;
          if (*p != e) {
            *p = *p + 1;
          }
        }
        else if (uVar4 == 3) {
          uVar6 = 0xffffffff;
          if (pbVar2 + 1 != (byte *)e) {
            *p = (char *)(pbVar2 + 2);
          }
        }
        else {
          uVar6 = 0xffffffff;
          if (uVar5 < 0x110000) {
            iVar3 = 1;
            if ((0x7f < uVar5) && (iVar3 = 2, 0x7ff < uVar5)) {
              iVar3 = 4 - (uint)(uVar5 < 0x10000);
            }
            if (iVar3 == uVar4 + 1) {
              uVar6 = 0xffffffff;
              if (!html) {
                uVar6 = uVar5;
              }
              if (0x9f < uVar5) {
                uVar6 = uVar5;
              }
            }
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

uint32_t next(Iterator &p,Iterator e,bool html=false,bool /*decode*/=false)
	{
		using utf::illegal;
		if(p==e)
			return illegal;

		unsigned char lead = *p++;

		// First byte is fully validated here
		int trail_size = trail_length(lead);

		if(trail_size < 0)
			return illegal;

		//
		// Ok as only ASCII may be of size = 0
		// also optimize for ASCII text
		//
		if(trail_size == 0) {
			if(!html || (lead >= 0x20 && lead!=0x7F) || lead==0x9 || lead==0x0A || lead==0x0D)
				return lead;
			return illegal;
		}

		uint32_t c = lead & ((1<<(6-trail_size))-1);

		// Read the rest
		unsigned char tmp;
		switch(trail_size) {
			case 3:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
			case 2:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
			case 1:
				if(p==e)
					return illegal;
				tmp = *p++;
				if (!is_trail(tmp))
					return illegal;
				c = (c << 6) | ( tmp & 0x3F);
		}

		// Check code point validity: no surrogates and
		// valid range
		if(!utf::valid(c))
			return illegal;

		// make sure it is the most compact representation
		if(width(c)!=trail_size + 1)
			return illegal;
		
		if(html && c<0xA0)
			return illegal;
		return c;
	}